

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O2

void nrg::PrioExecution::
     push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>
               (Queue *queue,_func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *fn,
               AsyncResult<int> *param,AsyncResult<int> *param_4,AsyncResult<int> *param_5,
               int *param_6)

{
  QueueElement elem;
  undefined1 local_b8 [40];
  __shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2> local_90;
  int local_80;
  QueueElement local_78;
  QueueElement local_50;
  
  local_50.prio = 0;
  local_50.id = next()::nxt;
  next()::nxt = next()::nxt + 1;
  local_b8._0_8_ = fn;
  std::__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8)
             ,(__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2> *)param);
  std::__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2> *)
             (local_b8 + 0x18),
             (__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2> *)param_4);
  std::__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,
             (__shared_ptr<nrg::AsyncResult<int>::Impl,_(__gnu_cxx::_Lock_policy)2> *)param_5);
  local_80 = *param_6;
  std::function<void()>::
  function<nrg::PrioExecution::push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>(std::priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>&,void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int&&)::_lambda()_1_,void>
            ((function<void()> *)&local_50.what,(anon_class_64_5_11abe806 *)local_b8);
  push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>(std::priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>&,void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int&&)
  ::{lambda()#1}::~priority_queue((_lambda___1_ *)local_b8);
  QueueElement::QueueElement(&local_78,&local_50);
  std::
  priority_queue<nrg::PrioExecution::QueueElement,_std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>,_std::greater<nrg::PrioExecution::QueueElement>_>
  ::push(queue,&local_78);
  std::_Function_base::~_Function_base(&local_78.what.super__Function_base);
  std::_Function_base::~_Function_base(&local_50.what.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { 0, next(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }